

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive.cpp
# Opt level: O0

CAmount wallet::OutputGetCredit(CWallet *wallet,CTxOut *txout,isminefilter *filter)

{
  bool bVar1;
  isminetype iVar2;
  runtime_error *this;
  allocator<char> *in_RDX;
  CAmount *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff48;
  CTxOut *in_stack_ffffffffffffff50;
  CWallet *in_stack_ffffffffffffff58;
  CAmount CVar3;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined8 in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff80;
  string local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = MoneyRange((CAmount *)in_stack_ffffffffffffff48);
  if (bVar1) {
    MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>(in_stack_ffffffffffffff48);
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_RDX,in_stack_ffffffffffffff80
               ,(char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffff68 >> 0x18,0));
    iVar2 = CWallet::IsMine(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    if ((iVar2 & *(isminetype *)in_RDX) == ISMINE_NO) {
      CVar3 = 0;
    }
    else {
      CVar3 = *in_RSI;
    }
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return CVar3;
    }
  }
  else {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(in_RDI,(char *)in_RSI,in_RDX);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   (char *)in_stack_ffffffffffffff58);
    std::runtime_error::runtime_error(this,local_28);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

CAmount OutputGetCredit(const CWallet& wallet, const CTxOut& txout, const isminefilter& filter)
{
    if (!MoneyRange(txout.nValue))
        throw std::runtime_error(std::string(__func__) + ": value out of range");
    LOCK(wallet.cs_wallet);
    return ((wallet.IsMine(txout) & filter) ? txout.nValue : 0);
}